

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathLocalNameFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlElementType xVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr pxVar3;
  _xmlNode *value;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr value_00;
  int error;
  undefined4 in_register_00000034;
  xmlXPathContextPtr ctxt_00;
  
  value = (_xmlNode *)CONCAT44(in_register_00000034,nargs);
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    if (nargs != 0) {
      error = 0xc;
      goto LAB_001db591;
    }
    value = (_xmlNode *)xmlXPathCacheNewNodeSet(ctxt->context,ctxt->context->node);
    valuePush(ctxt,(xmlXPathObjectPtr)value);
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    error = 0x17;
LAB_001db591:
    xmlXPathErr(ctxt,error);
    return;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((ctxt->value->type | XPATH_USERS) != XPATH_XSLT_TREE)) {
    error = 0xb;
    goto LAB_001db591;
  }
  obj = valuePop(ctxt);
  pxVar2 = obj->nodesetval;
  if ((pxVar2 == (xmlNodeSetPtr)0x0) || (pxVar2->nodeNr == 0)) {
LAB_001db59d:
    ctxt_00 = ctxt->context;
LAB_001db5a1:
    value_00 = xmlXPathCacheNewCString(ctxt_00,(char *)value);
  }
  else {
    pxVar3 = *pxVar2->nodeTab;
    xVar1 = pxVar3->type;
    if (xVar1 - XML_ELEMENT_NODE < 2) {
LAB_001db55e:
      value = (_xmlNode *)pxVar3->name;
      ctxt_00 = ctxt->context;
      if (*(undefined1 *)&value->_private == 0x20) goto LAB_001db5a1;
    }
    else {
      if (xVar1 != XML_NAMESPACE_DECL) {
        if (xVar1 != XML_PI_NODE) goto LAB_001db59d;
        goto LAB_001db55e;
      }
      ctxt_00 = ctxt->context;
      value = pxVar3->children;
    }
    value_00 = xmlXPathCacheNewString(ctxt_00,(xmlChar *)value);
  }
  valuePush(ctxt,value_00);
  xmlXPathReleaseObject(ctxt->context,obj);
  return;
}

Assistant:

void
xmlXPathLocalNameFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;

    if (nargs == 0) {
	valuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt->context,
	    ctxt->context->node));
	nargs = 1;
    }

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = valuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
	valuePush(ctxt, xmlXPathCacheNewCString(ctxt->context, ""));
    } else {
	int i = 0; /* Should be first in document order !!!!! */
	switch (cur->nodesetval->nodeTab[i]->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	case XML_PI_NODE:
	    if (cur->nodesetval->nodeTab[i]->name[0] == ' ')
		valuePush(ctxt, xmlXPathCacheNewCString(ctxt->context, ""));
	    else
		valuePush(ctxt,
		      xmlXPathCacheNewString(ctxt->context,
			cur->nodesetval->nodeTab[i]->name));
	    break;
	case XML_NAMESPACE_DECL:
	    valuePush(ctxt, xmlXPathCacheNewString(ctxt->context,
			((xmlNsPtr)cur->nodesetval->nodeTab[i])->prefix));
	    break;
	default:
	    valuePush(ctxt, xmlXPathCacheNewCString(ctxt->context, ""));
	}
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}